

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

PropertySymOpnd * IR::PropertySymOpnd::New(PropertySym *propertySym,IRType type,Func *func)

{
  JitArenaAllocator *pJVar1;
  PropertySymOpnd *this;
  JITTypeHolderBase<void> local_70;
  JITTypeHolderBase<void> local_68;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  PropertySymOpnd *local_28;
  PropertySymOpnd *newOpnd;
  Func *func_local;
  PropertySym *pPStack_10;
  IRType type_local;
  PropertySym *propertySym_local;
  
  pJVar1 = func->m_alloc;
  newOpnd = (PropertySymOpnd *)func;
  func_local._7_1_ = type;
  pPStack_10 = propertySym;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
             ,0x357);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_50);
  local_60 = Memory::JitArenaAllocator::Alloc;
  local_58 = 0;
  this = (PropertySymOpnd *)new<Memory::JitArenaAllocator>(0x68,pJVar1,0x4e98c0);
  PropertySymOpnd(this);
  (this->super_SymOpnd).m_sym = &pPStack_10->super_Sym;
  (this->super_SymOpnd).m_offset = 0;
  (this->super_SymOpnd).super_Opnd.m_type = func_local._7_1_;
  local_28 = this;
  SetObjTypeSpecFldInfo(this,(ObjTypeSpecFldInfo *)0x0);
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_68,(JITType *)0x0);
  (local_28->finalType).t = local_68.t;
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_70,(JITType *)0x0);
  (local_28->monoGuardType).t = local_70.t;
  local_28->guardedPropOps = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  local_28->writeGuards = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (local_28->field_12).objTypeSpecFlags = 0;
  (local_28->super_SymOpnd).super_Opnd.field_0xb =
       (local_28->super_SymOpnd).super_Opnd.field_0xb & 0xbf | 0x40;
  local_28->checkedTypeSetIndex = 0xffff;
  (local_28->super_SymOpnd).super_Opnd.m_kind = OpndKindSym;
  return local_28;
}

Assistant:

PropertySymOpnd *
PropertySymOpnd::New(PropertySym *propertySym, IRType type, Func *func)
{
    PropertySymOpnd *newOpnd = JitAnew(func->m_alloc, IR::PropertySymOpnd);
    newOpnd->m_sym = propertySym;
    newOpnd->m_offset = 0;
    newOpnd->m_type = type;
    newOpnd->SetObjTypeSpecFldInfo(nullptr);
    newOpnd->finalType = JITTypeHolder(nullptr);
    newOpnd->monoGuardType = JITTypeHolder(nullptr);
    newOpnd->guardedPropOps = nullptr;
    newOpnd->writeGuards = nullptr;
    newOpnd->objTypeSpecFlags = 0;
    newOpnd->isPropertySymOpnd = true;
    newOpnd->checkedTypeSetIndex = (uint16)-1;

    newOpnd->m_kind = OpndKindSym;

    return newOpnd;
}